

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O2

void __thiscall FIWadManager::ClearChecks(FIWadManager *this)

{
  int *piVar1;
  uint i;
  ulong uVar2;
  
  TArray<int,_int>::Resize(&this->mLumpsFound,(this->mIWads).Count);
  piVar1 = (this->mLumpsFound).Array;
  for (uVar2 = 0; uVar2 < (this->mLumpsFound).Count; uVar2 = uVar2 + 1) {
    piVar1[uVar2] = 0;
  }
  return;
}

Assistant:

void FIWadManager::ClearChecks()
{
	mLumpsFound.Resize(mIWads.Size());
	for(unsigned i=0;i<mLumpsFound.Size(); i++)
	{
		mLumpsFound[i] = 0;
	}
}